

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringview.h
# Opt level: O1

bool QtPrivate::startsWith(QLatin1StringView haystack,QLatin1StringView needle,CaseSensitivity cs)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  QLatin1StringView lhs;
  
  lhs.m_data = haystack.m_data;
  pcVar3 = (char *)needle.m_size;
  pcVar1 = needle.m_data;
  if ((lhs.m_data != (char *)0x0) && (pcVar1 = pcVar3, haystack.m_size != 0)) {
    if ((long)pcVar3 <= haystack.m_size) {
      lhs.m_size = (qsizetype)pcVar3;
      iVar2 = compareStrings(lhs,needle,cs);
      return iVar2 == 0;
    }
    return false;
  }
  return pcVar1 == (char *)0x0;
}

Assistant:

constexpr bool isNull() const noexcept { return !data(); }